

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

void generate_SSA(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes,map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                         *global,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom_f,vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *vars,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  _Rb_tree_node_base *__v;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer pVVar3;
  _Rb_tree_node_base *p_Var4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this;
  _Base_ptr p_Var9;
  BasicBlock *b_00;
  _Self __tmp;
  ulong uVar10;
  long lVar11;
  _Self __tmp_1;
  int b;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_298;
  _Rb_tree_node_base *local_290;
  _Base_ptr local_288;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_280;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_278;
  ulong local_270;
  shared_ptr<mir::inst::PhiInst> irphi;
  VarId local_238;
  undefined **local_228;
  undefined4 local_220;
  undefined **local_218;
  undefined4 local_210;
  undefined **local_208;
  undefined4 local_200;
  shared_ptr<mir::inst::PhiInst> irphi_1;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom_tree;
  _Base_ptr local_1b8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_198;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_180;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  phi;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> varset;
  VarId local_100;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  phi._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &phi._M_t._M_impl.super__Rb_tree_header._M_header;
  phi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  phi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  phi._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_290 = &(global->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_288 = &(dom_f->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var9 = (global->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_298 = &dom->_M_t;
  local_280 = &dom_f->_M_t;
  local_278 = &nodes->_M_t;
  phi._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       phi._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; p_Var9 != local_290; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&dom_tree);
    __v = p_Var9 + 1;
    for (p_Var4 = p_Var9[2]._M_parent; p_Var4 != (_Rb_tree_node_base *)&p_Var9[1]._M_right;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::deque<int,_std::allocator<int>_>::push_back
                ((deque<int,_std::allocator<int>_> *)&dom_tree,(value_type_conflict3 *)(p_Var4 + 1))
      ;
    }
    while (local_1b8 != dom_tree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      b = (dom_tree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color;
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&dom_tree);
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(local_280,&b);
      if (iVar5._M_node != local_288) {
        lVar11 = 0;
        uVar10 = 0;
        while (uVar10 < (ulong)((long)iVar5._M_node[1]._M_left - (long)iVar5._M_node[1]._M_parent >>
                               2)) {
          iVar6 = std::
                  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::find(&phi._M_t,
                         (key_type *)((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11));
          local_270 = uVar10;
          if (-1 < *(int *)((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11)) {
            if ((_Rb_tree_header *)iVar6._M_node == &phi._M_t._M_impl.super__Rb_tree_header) {
              iVar8 = std::
                      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                      ::find(&nodes->_M_t,
                             (key_type *)((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11));
              local_208 = &PTR_display_001d90d0;
              local_200 = *(undefined4 *)&p_Var9[1]._M_parent;
              ir_phi((VarId *)&irphi_1,(int)&local_208);
              p_Var1 = iVar8._M_node[1]._M_parent;
              p_Var2 = p_Var1->_M_parent;
              std::
              variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
              ::
              variant<std::shared_ptr<mir::inst::PhiInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
                        ((variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                          *)&varset,&irphi_1);
              std::
              vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
              ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                *)&p_Var1->_M_parent,(const_iterator)&p_Var2->_M_right,
                               (value_type *)&varset);
              std::__detail::__variant::
              _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                   *)&varset);
              irphi.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 0;
              std::
              _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              ::_M_insert_unique<mir::inst::VarId_const&>
                        ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                          *)&irphi,(VarId *)__v);
              std::
              pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
              ::
              pair<int_&,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_&,_true>
                        ((pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                          *)&varset,(int *)((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11),
                         (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)&irphi);
              std::
              _Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
              ::
              _M_insert_unique<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
                        ((_Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
                          *)&phi,(pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                                  *)&varset);
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&varset._M_t._M_impl.super__Rb_tree_header);
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)&dom_tree,
                         (value_type_conflict3 *)
                         ((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11));
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&irphi);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irphi_1.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            else {
              iVar7 = std::
                      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::find((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              *)&iVar6._M_node[1]._M_parent,(key_type *)__v);
              if (iVar7._M_node == (_Base_ptr)&iVar6._M_node[1]._M_left) {
                iVar8 = std::
                        _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                        ::find(&nodes->_M_t,
                               (key_type *)((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11))
                ;
                local_218 = &PTR_display_001d90d0;
                local_210 = *(undefined4 *)&p_Var9[1]._M_parent;
                ir_phi((VarId *)&irphi,(int)&local_218);
                p_Var1 = iVar8._M_node[1]._M_parent;
                p_Var2 = p_Var1->_M_parent;
                std::
                variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                ::
                variant<std::shared_ptr<mir::inst::PhiInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
                          ((variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                            *)&varset,&irphi);
                std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                  *)&p_Var1->_M_parent,(const_iterator)&p_Var2->_M_right,
                                 (value_type *)&varset);
                std::__detail::__variant::
                _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                     *)&varset);
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)&varset,
                           (_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)&iVar6._M_node[1]._M_parent);
                std::
                _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                ::_M_insert_unique<mir::inst::VarId_const&>
                          ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                            *)&varset,(VarId *)__v);
                this = &std::
                        map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                        ::operator[](&phi,(key_type *)
                                          ((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11))
                        ->_M_t;
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::operator=(this,(_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                  *)&varset);
                std::deque<int,_std::allocator<int>_>::push_back
                          ((deque<int,_std::allocator<int>_> *)&dom_tree,
                           (value_type_conflict3 *)
                           ((long)&(iVar5._M_node[1]._M_parent)->_M_color + lVar11));
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)&varset);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&irphi.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                nodes = (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                         *)local_278;
              }
            }
          }
          lVar11 = lVar11 + 4;
          uVar10 = local_270 + 1;
        }
      }
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&dom_tree);
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_180,vars);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_198,&notRename);
  vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&dom_tree,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_180,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_198);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_move_assign(vars,&dom_tree);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
            ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&dom_tree);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_198);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base(&local_180);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_c0,local_298);
  build_dom_tree(&dom_tree,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &local_c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c0);
  lVar11 = 8;
  for (uVar10 = 0;
      pVVar3 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(vars->
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 4);
      uVar10 = uVar10 + 1) {
    if (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_start) {
      V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_finish =
           V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_228 = &PTR_display_001d90d0;
    local_220 = *(undefined4 *)((long)&(pVVar3->super_Displayable)._vptr_Displayable + lVar11);
    rename((char *)&local_100,(char *)&local_228);
    push(&local_100);
    local_238.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_238.id = *(uint32_t *)
                    ((long)&(((vars->
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              )._M_impl.super__Vector_impl_data._M_start)->super_Displayable).
                            _vptr_Displayable + lVar11);
    std::
    _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::_Rb_tree(&local_f0,&nodes->_M_t);
    b_00 = find_entry((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                       *)&local_f0);
    std::
    _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::_Rb_tree(&local_60,&nodes->_M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&local_90,&dom_tree._M_t);
    rename_var(&local_238,b_00,
               (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                *)&local_60,
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&local_90);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::~_Rb_tree(&local_f0);
    lVar11 = lVar11 + 0x10;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&dom_tree._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&phi._M_t);
  return;
}

Assistant:

void generate_SSA(map<int, BasicBlock*> nodes,
                  map<mir::inst::VarId, set<int>> global,
                  map<int, vector<int>> dom_f, vector<mir::inst::VarId> vars,
                  map<int, int> dom) {
  map<mir::inst::VarId, set<int>>::iterator it;
  map<int, set<mir::inst::VarId>> phi;
  for (it = global.begin(); it != global.end(); it++) {
    queue<int> q;
    set<int>::iterator s;
    for (s = it->second.begin(); s != it->second.end(); s++) {
      q.push(*s);
    }
    while (!q.empty()) {
      int b = q.front();
      q.pop();
      map<int, vector<int>>::iterator itt = dom_f.find(b);
      if (itt != dom_f.end()) {
        for (int i = 0; i < itt->second.size(); i++) {
          map<int, set<mir::inst::VarId>>::iterator iter =
              phi.find(itt->second[i]);
          if (itt->second[i] >= 0) {
            if (iter == phi.end()) {
              map<int, BasicBlock*>::iterator itera =
                  nodes.find(itt->second[i]);
              shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
              //(*irphi).display(cout);
              itera->second->inst.insert(itera->second->inst.begin() + 1,
                                         irphi);
              set<mir::inst::VarId> varset;
              varset.insert(it->first);
              phi.insert(map<int, set<mir::inst::VarId>>::value_type(
                  itt->second[i], varset));
              q.push(itt->second[i]);
            } else {
              set<mir::inst::VarId>::iterator ss;
              ss = iter->second.find(it->first);
              if (ss == iter->second.end()) {
                map<int, BasicBlock*>::iterator itera =
                    nodes.find(itt->second[i]);
                shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
                //(*irphi).display(cout);
                itera->second->inst.insert(itera->second->inst.begin() + 1,
                                           irphi);
                set<mir::inst::VarId> varset = iter->second;
                varset.insert(it->first);
                phi[itt->second[i]] = varset;
                q.push(itt->second[i]);
              }
            }
          }
        }
      }
    }
  }

  // step3: number the vars, don't rename the $0(return value)
  vars = vectors_difference(vars, notRename);
  map<int, vector<int>> dom_tree = build_dom_tree(dom);
  for (int i = 0; i < vars.size(); i++) {
    V.clear();
    push(rename(vars[i]));
    rename_var(vars[i], find_entry(nodes), nodes, dom_tree);
  }
}